

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UnlinkAndDeleteIndex(sqlite3 *db,int iDb,char *zIdxName)

{
  undefined8 uVar1;
  void *pvVar2;
  void *in_RDI;
  bool bVar3;
  char *unaff_retaddr;
  Index *p;
  Hash *pHash;
  Index *pIndex;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  sqlite3 *in_stack_ffffffffffffffd0;
  
  pvVar2 = sqlite3HashInsert((Hash *)p,unaff_retaddr,in_RDI);
  if (pvVar2 != (void *)0x0) {
    if (*(void **)(*(long *)((long)pvVar2 + 0x18) + 0x10) == pvVar2) {
      *(undefined8 *)(*(long *)((long)pvVar2 + 0x18) + 0x10) = *(undefined8 *)((long)pvVar2 + 0x28);
    }
    else {
      in_stack_ffffffffffffffd0 = *(sqlite3 **)(*(long *)((long)pvVar2 + 0x18) + 0x10);
      while( true ) {
        bVar3 = false;
        if (in_stack_ffffffffffffffd0 != (sqlite3 *)0x0) {
          bVar3 = *(void **)&in_stack_ffffffffffffffd0->nDb != pvVar2;
        }
        if (!bVar3) break;
        in_stack_ffffffffffffffd0 = *(sqlite3 **)&in_stack_ffffffffffffffd0->nDb;
      }
      if ((in_stack_ffffffffffffffd0 != (sqlite3 *)0x0) &&
         (*(void **)&in_stack_ffffffffffffffd0->nDb == pvVar2)) {
        uVar1 = *(undefined8 *)((long)pvVar2 + 0x28);
        in_stack_ffffffffffffffd0->nDb = (int)uVar1;
        in_stack_ffffffffffffffd0->flags = (int)((ulong)uVar1 >> 0x20);
      }
      in_stack_ffffffffffffffcf = 0;
    }
    freeIndex(in_stack_ffffffffffffffd0,
              (Index *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  }
  *(uint *)((long)in_RDI + 0x2c) = *(uint *)((long)in_RDI + 0x2c) | 2;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UnlinkAndDeleteIndex(sqlite3 *db, int iDb, const char *zIdxName){
  Index *pIndex;
  Hash *pHash;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pHash = &db->aDb[iDb].pSchema->idxHash;
  pIndex = sqlite3HashInsert(pHash, zIdxName, 0);
  if( ALWAYS(pIndex) ){
    if( pIndex->pTable->pIndex==pIndex ){
      pIndex->pTable->pIndex = pIndex->pNext;
    }else{
      Index *p;
      /* Justification of ALWAYS();  The index must be on the list of
      ** indices. */
      p = pIndex->pTable->pIndex;
      while( ALWAYS(p) && p->pNext!=pIndex ){ p = p->pNext; }
      if( ALWAYS(p && p->pNext==pIndex) ){
        p->pNext = pIndex->pNext;
      }
    }
    freeIndex(db, pIndex);
  }
  db->flags |= SQLITE_InternChanges;
}